

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O2

void __thiscall
PlantUmlGenerator::transitionLink
          (PlantUmlGenerator *this,ostream *output,string *indent,bool isTransitionHighlighted,
          ScName *stateAliasOrigin,ScName *stateAliasTarget,ScNameSet *eventNames)

{
  bool bVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  undefined7 in_register_00000009;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> eventName;
  ScName local_70;
  ScName local_50;
  
  poVar2 = std::operator<<(output,(string *)indent);
  poVar2 = std::operator<<(poVar2,(string *)stateAliasOrigin);
  pcVar4 = "-->";
  if ((int)CONCAT71(in_register_00000009,isTransitionHighlighted) != 0) {
    pcVar4 = "-[#red,bold]-->";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,(string *)stateAliasTarget);
  std::operator<<(poVar2," : ");
  for (p_Var3 = (eventNames->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(eventNames->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
    if (local_50._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_50);
    }
    bVar1 = ::AbstractGenerator::isHighlighted(&this->super_AbstractGenerator,&local_50);
    if (bVar1) {
      poVar2 = std::operator<<(output,"<b>");
      removeNamespaces(&local_70,&local_50);
      poVar2 = std::operator<<(poVar2,(string *)&local_70);
      std::operator<<(poVar2,"</b>\\n");
    }
    else {
      removeNamespaces(&local_70,&local_50);
      poVar2 = std::operator<<(output,(string *)&local_70);
      std::operator<<(poVar2,"\\n");
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator<<(output,"\n");
  return;
}

Assistant:

void PlantUmlGenerator::transitionLink(std::ostream &output, std::string &indent,
                                       bool isTransitionHighlighted, const ScName &stateAliasOrigin,
                                       const ScName &stateAliasTarget, const ScNameSet &eventNames)
{

    if (isTransitionHighlighted) {
        output << indent << stateAliasOrigin << "-[#red,bold]-->" << stateAliasTarget << " : ";
    } else {
        output << indent << stateAliasOrigin << "-->" << stateAliasTarget << " : ";
    }

    for (auto eventName : eventNames) {
        if (eventName.empty()) {
            eventName = "<unknown>";
        }

        if (isHighlighted(eventName)) {
            output << "<b>" << removeNamespaces(eventName) << "</b>\\n";
        } else {
            output << removeNamespaces(eventName) << "\\n";
        }
    }

    output << "\n";
}